

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_im2col_back_f32(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  long lVar11;
  long lVar12;
  void *pvVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int64_t tmph;
  long lVar21;
  char *pcVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined8 uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  bool bVar38;
  float fVar39;
  long local_118;
  long local_100;
  long local_f0;
  
  pgVar9 = dst->src[0];
  if (pgVar9->type == GGML_TYPE_F32) {
    pgVar10 = dst->src[1];
    if (pgVar10->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        lVar24 = dst->ne[1];
        iVar16 = (int)dst->nb[2];
        iVar1 = dst->op_params[6];
        bVar38 = iVar1 != 1;
        lVar30 = dst->ne[2];
        lVar15 = dst->ne[3];
        if (bVar38) {
          lVar30 = lVar24;
          lVar15 = dst->ne[2];
        }
        if (bVar38) {
          lVar24 = 1;
        }
        lVar25 = pgVar10->ne[1];
        if (bVar38) {
          lVar25 = 1;
        }
        lVar31 = 1;
        if (!bVar38) {
          lVar31 = pgVar9->ne[2];
        }
        iVar23 = (int)dst->nb[3];
        if (bVar38) {
          iVar23 = iVar16;
        }
        if (bVar38) {
          iVar16 = (int)dst->nb[1];
        }
        if (dst->nb[0] == 4) {
          if (0 < lVar15) {
            lVar11 = pgVar10->ne[0];
            lVar12 = dst->ne[0];
            iVar2 = dst->op_params[0];
            iVar3 = dst->op_params[1];
            iVar4 = dst->op_params[2];
            iVar5 = dst->op_params[3];
            iVar6 = dst->op_params[4];
            iVar7 = dst->op_params[5];
            lVar35 = (long)params->ith;
            iVar8 = params->nth;
            pvVar13 = dst->data;
            lVar17 = lVar25 * lVar11;
            lVar14 = pgVar9->ne[1];
            local_100 = 0;
            lVar27 = 0;
            do {
              if (lVar35 < lVar30) {
                lVar37 = lVar35;
                local_118 = lVar17 * lVar35;
                do {
                  if (0 < lVar24) {
                    lVar26 = 0;
                    do {
                      if (0 < lVar12) {
                        lVar20 = 0;
                        local_f0 = (long)iVar4;
                        do {
                          fVar39 = 0.0;
                          if (0 < lVar25) {
                            lVar36 = 0;
                            lVar34 = local_118;
                            do {
                              if (0 < lVar11) {
                                lVar21 = (iVar5 + lVar26) - lVar36 * iVar7;
                                lVar28 = local_f0;
                                lVar32 = lVar11;
                                lVar33 = lVar34;
                                do {
                                  lVar18 = lVar28 / (long)iVar2;
                                  if (lVar28 % (long)iVar2 == 0) {
                                    if (iVar1 == 1) {
                                      lVar19 = lVar21 / (long)iVar3;
                                      if (lVar21 % (long)iVar3 != 0) goto LAB_001415df;
                                    }
                                    else {
                                      lVar19 = 0;
                                    }
                                    if ((((-1 < lVar18) && (lVar18 < lVar14)) && (-1 < lVar19)) &&
                                       (lVar19 < lVar31)) {
                                      fVar39 = fVar39 + *(float *)((long)pgVar9->data +
                                                                  lVar33 * 4 +
                                                                  (lVar18 + (local_100 + lVar19) *
                                                                            lVar14) *
                                                                  lVar17 * lVar30 * 4);
                                    }
                                  }
LAB_001415df:
                                  lVar28 = lVar28 - iVar6;
                                  lVar33 = lVar33 + 1;
                                  lVar32 = lVar32 + -1;
                                } while (lVar32 != 0);
                              }
                              lVar36 = lVar36 + 1;
                              lVar34 = lVar34 + lVar11;
                            } while (lVar36 != lVar25);
                          }
                          *(float *)((long)pvVar13 +
                                    lVar20 * 4 +
                                    lVar26 * lVar12 * 4 + lVar37 * iVar16 + lVar27 * iVar23) =
                               fVar39;
                          lVar20 = lVar20 + 1;
                          local_f0 = local_f0 + 1;
                        } while (lVar20 != lVar12);
                      }
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != lVar24);
                  }
                  lVar37 = lVar37 + iVar8;
                  local_118 = local_118 + lVar17 * iVar8;
                } while (lVar37 < lVar30);
              }
              lVar27 = lVar27 + 1;
              local_100 = local_100 + lVar31;
            } while (lVar27 != lVar15);
          }
          return;
        }
        pcVar22 = "nb0 == sizeof(float)";
        uVar29 = 0x171c;
      }
      else {
        pcVar22 = "dst->type == GGML_TYPE_F32";
        uVar29 = 0x16ff;
      }
    }
    else {
      pcVar22 = "src1->type == GGML_TYPE_F32";
      uVar29 = 0x16fe;
    }
  }
  else {
    pcVar22 = "src0->type == GGML_TYPE_F32";
    uVar29 = 0x16fd;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar29,"GGML_ASSERT(%s) failed",pcVar22);
}

Assistant:

void ggml_compute_forward_im2col_back_f32(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0]; // gradients of forward pass output
    const ggml_tensor * src1 = dst->src[1]; // convolution kernel

    GGML_ASSERT(src0->type == GGML_TYPE_F32);
    GGML_ASSERT(src1->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    GGML_TENSOR_BINARY_OP_LOCALS;

    const int32_t s0 = ((const int32_t *)(dst->op_params))[0];
    const int32_t s1 = ((const int32_t *)(dst->op_params))[1];
    const int32_t p0 = ((const int32_t *)(dst->op_params))[2];
    const int32_t p1 = ((const int32_t *)(dst->op_params))[3];
    const int32_t d0 = ((const int32_t *)(dst->op_params))[4];
    const int32_t d1 = ((const int32_t *)(dst->op_params))[5];
    const bool is_2D = ((const int32_t *)(dst->op_params))[6] == 1;

    const int ith = params->ith;
    const int nth = params->nth;

    const int64_t N  = is_2D ? ne3 : ne2;
    const int64_t IC = is_2D ? ne2 : ne1;
    const int64_t IH = is_2D ? ne1 : 1;
    const int64_t IW = ne0;

    const int64_t KH = is_2D ? ne11 : 1;
    const int64_t KW = ne10;

    const int64_t OH = is_2D ? ne02 : 1;
    const int64_t OW = ne01;

    int ofs0 = is_2D ? nb3 : nb2;
    int ofs1 = is_2D ? nb2 : nb1;

    GGML_ASSERT(nb0  == sizeof(float));

    // im2col: [N, IC, IH, IW] => [N, OH, OW, IC*KH*KW]
    {
        float * const wdata = (float *) dst->data;

        for (int64_t in = 0; in < N; in++) {
            for (int64_t iic = ith; iic < IC; iic += nth) {
                for (int64_t iih = 0; iih < IH; iih++) {
                    for (int64_t iiw = 0; iiw < IW; iiw++) {

                        // micro kernel
                        float grad = 0.0f;
                        for (int64_t ikh = 0; ikh < KH; ikh++) {
                            for (int64_t ikw = 0; ikw < KW; ikw++) {
                                // For s0 > 1 some values were skipped over in the forward pass.
                                // These values have tmpw % s0 != 0 and need to be skipped in the backwards pass as well.
                                const int64_t tmpw = (iiw + p0 - ikw*d0);
                                if (tmpw % s0 != 0) {
                                    continue;
                                }
                                const int64_t iow = tmpw / s0;

                                // Equivalent logic as above except for s1.
                                int64_t ioh;
                                if (is_2D) {
                                    const int64_t tmph = iih + p1 - ikh*d1;

                                    if (tmph % s1 != 0) {
                                        continue;
                                    }

                                    ioh = tmph / s1;
                                } else {
                                    ioh = 0;
                                }

                                if (iow < 0 || iow >= OW || ioh < 0 || ioh >= OH) {
                                    continue;
                                }

                                const float * const grad_in = (const float *) src0->data
                                    + (in*OH*OW + ioh*OW + iow)*(IC*KH*KW); // [IC, KH, KW]
                                grad += grad_in[iic*(KH*KW) + ikh*KW + ikw];
                            }
                        }
                        float * dst_data = (float *)((char *) wdata + (in*ofs0 + iic*ofs1)); // [IH, IW]
                        dst_data[iih*IW + iiw] = grad;
                    }
                }
            }
        }
    }
}